

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::AsyncCase::fetchLogMessages(AsyncCase *this)

{
  code *pcVar1;
  undefined4 uVar2;
  int iVar3;
  deBool dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestError *pTVar6;
  undefined8 uVar7;
  mapped_type *pmVar8;
  MessageID local_80;
  ScopedLock local_70;
  ScopedLock lock;
  undefined1 local_58 [8];
  MessageData msg;
  int local_20;
  int msgLen;
  int msgNdx;
  GLint numMsg;
  Functions *gl;
  AsyncCase *this_local;
  
  gl = (Functions *)this;
  pRVar5 = gles31::Context::getRenderContext
                     ((this->super_BaseCase).super_ErrorCase.super_TestCase.m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  _msgNdx = CONCAT44(extraout_var,iVar3);
  msgLen = 0;
  (**(code **)(_msgNdx + 0x868))(0x9145,&msgLen);
  local_20 = 0;
  do {
    if (msgLen <= local_20) {
      return;
    }
    msg.message.field_2._12_4_ = 0;
    MessageData::MessageData((MessageData *)local_58);
    (**(code **)(_msgNdx + 0x868))(0x8243,(undefined1 *)((long)&msg.message.field_2 + 0xc));
    do {
      dVar4 = ::deGetFalse();
      if ((dVar4 != 0) || ((int)msg.message.field_2._12_4_ < 0)) {
        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar6,"Negative message length","msgLen >= 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
                   ,0x650);
        __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    do {
      dVar4 = ::deGetFalse();
      if ((dVar4 != 0) || (99999 < (int)msg.message.field_2._12_4_)) {
        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar6,"Excessively long message","msgLen < 100000",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
                   ,0x651);
        __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    std::__cxx11::string::resize((ulong)&msg.id.id);
    uVar2 = msg.message.field_2._12_4_;
    pcVar1 = *(code **)(_msgNdx + 0x7e0);
    uVar7 = std::__cxx11::string::operator[]((ulong)&msg.id.id);
    (*pcVar1)(1,uVar2,local_58,local_58 + 4,&msg,&msg.id.type,
              (undefined1 *)((long)&msg.message.field_2 + 0xc),uVar7);
    de::ScopedLock::ScopedLock(&local_70,&this->m_mutex);
    local_80.id = msg.id.source;
    local_80.source = local_58._0_4_;
    local_80.type = local_58._4_4_;
    pmVar8 = std::
             map<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::AsyncCase::MessageCount,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::AsyncCase::MessageCount>_>_>
             ::operator[](&this->m_counts,&local_80);
    pmVar8->received = pmVar8->received + 1;
    de::ScopedLock::~ScopedLock(&local_70);
    MessageData::~MessageData((MessageData *)local_58);
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

void AsyncCase::fetchLogMessages (void)
{
	const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
	GLint					numMsg	= 0;

	gl.getIntegerv(GL_DEBUG_LOGGED_MESSAGES, &numMsg);

	for(int msgNdx = 0; msgNdx < numMsg; msgNdx++)
	{
		int			msgLen = 0;
		MessageData msg;

		gl.getIntegerv(GL_DEBUG_NEXT_LOGGED_MESSAGE_LENGTH, &msgLen);

		TCU_CHECK_MSG(msgLen >= 0, "Negative message length");
		TCU_CHECK_MSG(msgLen < 100000, "Excessively long message");

		msg.message.resize(msgLen);
		gl.getDebugMessageLog(1, msgLen, &msg.id.source, &msg.id.type, &msg.id.id, &msg.severity, &msgLen, &msg.message[0]);

		{
			const de::ScopedLock lock(m_mutex); // Don't block during API call

			m_counts[MessageID(msg.id)].received++;
		}
	}
}